

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer_00;
  int iVar1;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  pointer __old_p;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer;
  allocator local_171;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string filename;
  string classname;
  GeneratedCodeInfo annotations;
  string local_f0;
  string info_full_path;
  string java_package;
  string info_relative_path;
  string local_70;
  string package_dir;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_00;
  
  FileJavaPackage_abi_cxx11_(&java_package,(java *)this->file_,(FileDescriptor *)file_list);
  std::__cxx11::string::string((string *)&local_70,(string *)&java_package);
  JavaPackageToDir(&package_dir,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((this->options_).enforce_lite == false) {
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              (&classname,
               (this->name_resolver_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
               _M_head_impl,this->file_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&annotations
                   ,&package_dir,&classname);
    std::operator+(&filename,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&annotations
                   ,".java");
    std::__cxx11::string::~string((string *)&annotations);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,&filename);
    iVar1 = (*context->_vptr_GeneratorContext[2])(context,&filename);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar1);
    GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
    annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
         (_func_int **)&PTR_AddAnnotation_004d7460;
    annotation_collector.annotation_proto_ = &annotations;
    printer._M_t.
    super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
    .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl =
         (__uniq_ptr_data<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>,_true,_true>
          )operator_new(0xa0);
    annotation_collector_00 = &annotation_collector;
    if ((this->options_).annotate_code == false) {
      annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0
      ;
    }
    io::Printer::Printer
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,output,
               '$',&annotation_collector_00->super_AnnotationCollector);
    std::operator+(&info_relative_path,&classname,".java.pb.meta");
    std::operator+(&info_full_path,&filename,".pb.meta");
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,
               "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_);
    if (java_package._M_string_length != 0) {
      io::Printer::Print<char[8],std::__cxx11::string>
                ((Printer *)
                 printer._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                 .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,
                 "package $package$;\n\n",(char (*) [8])0x42ba77,&java_package);
    }
    printer_00._M_t.
    super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
    .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl =
         printer._M_t.
         super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
         .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl;
    if ((this->options_).annotate_code == true) {
      std::__cxx11::string::string((string *)&local_f0,(string *)&info_relative_path);
    }
    else {
      std::__cxx11::string::string((string *)&local_f0,"",&local_171);
    }
    PrintGeneratedAnnotation
              ((Printer *)
               printer_00._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,'$',
               &local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    io::Printer::Print<char[10],std::__cxx11::string>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,
               "public final class $classname$ {\n  public static com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n  static {\n"
               ,(char (*) [10])0x3dd2a7,&classname);
    io::Printer::Annotate
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,
               "classname",*(string **)this->file_);
    io::Printer::Indent((Printer *)
                        printer._M_t.
                        super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                        .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl)
    ;
    io::Printer::Indent((Printer *)
                        printer._M_t.
                        super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                        .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl)
    ;
    GenerateDescriptors(this,(Printer *)
                             printer._M_t.
                             super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
                             .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>.
                             _M_head_impl);
    io::Printer::Outdent
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl);
    io::Printer::Outdent
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl);
    io::Printer::Print<>
              ((Printer *)
               printer._M_t.
               super___uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::Printer_*,_std::default_delete<google::protobuf::io::Printer>_>
               .super__Head_base<0UL,_google::protobuf::io::Printer_*,_false>._M_head_impl,
               "  }\n}\n");
    if ((this->options_).annotate_code == true) {
      iVar1 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
      output_00 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar1);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,output_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,&info_full_path);
      if (output_00 != (ZeroCopyOutputStream *)0x0) {
        (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
      }
    }
    std::
    __uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
    ::reset((__uniq_ptr_impl<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             *)&printer,(pointer)0x0);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
    std::__cxx11::string::~string((string *)&info_full_path);
    std::__cxx11::string::~string((string *)&info_relative_path);
    std::
    unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>::
    ~unique_ptr(&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&classname);
  }
  std::__cxx11::string::~string((string *)&package_dir);
  std::__cxx11::string::~string((string *)&java_package);
  return;
}

Assistant:

void SharedCodeGenerator::Generate(
    GeneratorContext* context, std::vector<std::string>* file_list,
    std::vector<std::string>* annotation_file_list) {
  std::string java_package = FileJavaPackage(file_);
  std::string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    std::string classname = name_resolver_->GetDescriptorClassName(file_);
    std::string filename = package_dir + classname + ".java";
    file_list->push_back(filename);
    std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::unique_ptr<io::Printer> printer(
        new io::Printer(output.get(), '$',
                        options_.annotate_code ? &annotation_collector : NULL));
    std::string info_relative_path = classname + ".java.pb.meta";
    std::string info_full_path = filename + ".pb.meta";
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// source: $filename$\n"
        "\n",
        "filename", file_->name());
    if (!java_package.empty()) {
      printer->Print(
          "package $package$;\n"
          "\n",
          "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "");
    printer->Print(
        "public final class $classname$ {\n"
        "  public static com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n"
        "  static {\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");

    if (options_.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}